

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O1

void SetClipboardTextFn_DefaultImpl(void *param_1,char *text)

{
  int *piVar1;
  int iVar2;
  char *pcVar3;
  int iVar4;
  ImGuiContext *pIVar5;
  size_t __n;
  char *__dest;
  int iVar6;
  ImGuiContext *ctx;
  int iVar7;
  
  pIVar5 = GImGui;
  pcVar3 = (GImGui->PrivateClipboard).Data;
  if (pcVar3 != (char *)0x0) {
    (pIVar5->PrivateClipboard).Size = 0;
    (pIVar5->PrivateClipboard).Capacity = 0;
    if (pIVar5 != (ImGuiContext *)0x0) {
      piVar1 = &(pIVar5->IO).MetricsActiveAllocations;
      *piVar1 = *piVar1 + -1;
    }
    (*GImAllocatorFreeFunc)(pcVar3,GImAllocatorUserData);
    (pIVar5->PrivateClipboard).Data = (char *)0x0;
  }
  __n = strlen(text);
  iVar4 = (int)__n;
  iVar6 = iVar4 + 1;
  iVar2 = (pIVar5->PrivateClipboard).Capacity;
  if (iVar2 <= iVar4) {
    if (iVar2 == 0) {
      iVar7 = 8;
    }
    else {
      iVar7 = iVar2 / 2 + iVar2;
    }
    if (iVar7 <= iVar6) {
      iVar7 = iVar6;
    }
    if (iVar2 < iVar7) {
      if (GImGui != (ImGuiContext *)0x0) {
        piVar1 = &(GImGui->IO).MetricsActiveAllocations;
        *piVar1 = *piVar1 + 1;
      }
      __dest = (char *)(*GImAllocatorAllocFunc)((long)iVar7,GImAllocatorUserData);
      pcVar3 = (pIVar5->PrivateClipboard).Data;
      if (pcVar3 != (char *)0x0) {
        memcpy(__dest,pcVar3,(long)(pIVar5->PrivateClipboard).Size);
        pcVar3 = (pIVar5->PrivateClipboard).Data;
        if ((pcVar3 != (char *)0x0) && (GImGui != (ImGuiContext *)0x0)) {
          piVar1 = &(GImGui->IO).MetricsActiveAllocations;
          *piVar1 = *piVar1 + -1;
        }
        (*GImAllocatorFreeFunc)(pcVar3,GImAllocatorUserData);
      }
      (pIVar5->PrivateClipboard).Data = __dest;
      (pIVar5->PrivateClipboard).Capacity = iVar7;
    }
  }
  (pIVar5->PrivateClipboard).Size = iVar6;
  memcpy((pIVar5->PrivateClipboard).Data,text,__n);
  (pIVar5->PrivateClipboard).Data[iVar4] = '\0';
  return;
}

Assistant:

static void SetClipboardTextFn_DefaultImpl(void*, const char* text)
{
    ImGuiContext& g = *GImGui;
    g.PrivateClipboard.clear();
    const char* text_end = text + strlen(text);
    g.PrivateClipboard.resize((int)(text_end - text) + 1);
    memcpy(&g.PrivateClipboard[0], text, (size_t)(text_end - text));
    g.PrivateClipboard[(int)(text_end - text)] = 0;
}